

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O0

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>
duckdb::CopyDatabaseInfo::Deserialize(Deserializer *deserializer)

{
  char *tag;
  pointer this;
  Deserializer *in_RSI;
  CopyDatabaseInfo *in_RDI;
  unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true> result;
  pointer in_stack_ffffffffffffff98;
  unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
  *in_stack_ffffffffffffffa0;
  _Head_base<0UL,_duckdb::ParseInfo_*,_false> ret;
  undefined6 in_stack_ffffffffffffffd8;
  field_id_t in_stack_ffffffffffffffde;
  Deserializer *in_stack_ffffffffffffffe0;
  field_id_t in_stack_ffffffffffffffee;
  
  ret._M_head_impl = &in_RDI->super_ParseInfo;
  tag = (char *)operator_new(0x48);
  CopyDatabaseInfo(in_RDI);
  unique_ptr<duckdb::CopyDatabaseInfo,std::default_delete<duckdb::CopyDatabaseInfo>,true>::
  unique_ptr<std::default_delete<duckdb::CopyDatabaseInfo>,void>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>::
  operator->(in_stack_ffffffffffffffa0);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (in_RSI,in_stack_ffffffffffffffee,(char *)in_stack_ffffffffffffffe0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT26(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8));
  this = unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>::
         operator->(in_stack_ffffffffffffffa0);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,true>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffde,tag,
             (vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_true>
              *)ret._M_head_impl);
  unique_ptr<duckdb::ParseInfo,std::default_delete<duckdb::ParseInfo>,true>::
  unique_ptr<duckdb::CopyDatabaseInfo,std::default_delete<std::unique_ptr<duckdb::ParseInfo,std::default_delete<duckdb::ParseInfo>>>,void>
            ((unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)this,
             (unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>_> *
             )in_RSI);
  unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>::
  ~unique_ptr((unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
               *)0xae175a);
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (_Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>)
         ret._M_head_impl;
}

Assistant:

unique_ptr<ParseInfo> CopyDatabaseInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<CopyDatabaseInfo>(new CopyDatabaseInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "target_database", result->target_database);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<CreateInfo>>>(201, "entries", result->entries);
	return std::move(result);
}